

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderBuiltinVarTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::gles3::Functional::FragCoordWCase::iterate(FragCoordWCase *this)

{
  int height;
  TestLog *log;
  RenderContext *pRVar1;
  bool bVar2;
  int iVar3;
  deUint32 err;
  undefined4 extraout_var;
  RenderTarget *pRVar4;
  TestError *this_00;
  char *description;
  int y;
  uint uVar5;
  int x;
  int iVar6;
  float fVar7;
  float ny;
  allocator<char> local_299;
  RGBA local_298;
  RGBA threshold;
  Surface refImg;
  undefined1 local_270 [40];
  float positions [16];
  deUint16 indices [6];
  Surface testImg;
  VertexArrayBinding posBinding;
  ShaderProgram program;
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pRVar4 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar6 = pRVar4->m_width;
  pRVar4 = Context::getRenderTarget((this->super_TestCase).m_context);
  height = pRVar4->m_height;
  program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x1010101;
  pRVar4 = Context::getRenderTarget((this->super_TestCase).m_context);
  posBinding.binding.type = (Type)tcu::PixelFormat::getColorThreshold(&pRVar4->m_pixelFormat);
  threshold = tcu::operator+((RGBA *)&program,(RGBA *)&posBinding);
  tcu::Surface::Surface(&testImg,iVar6,height);
  tcu::Surface::Surface(&refImg,iVar6,height);
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)positions,
             "#version 300 es\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
             ,(allocator<char> *)indices);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_270,
             "#version 300 es\nlayout(location = 0) out mediump vec4 o_color;\nvoid main (void)\n{\n\to_color = vec4(0.0, 1.0/gl_FragCoord.w - 1.0, 0.0, 1.0);\n}\n"
             ,&local_299);
  glu::makeVtxFragSources((ProgramSources *)&posBinding,(string *)positions,(string *)local_270);
  glu::ShaderProgram::ShaderProgram(&program,pRVar1,(ProgramSources *)&posBinding);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&posBinding);
  std::__cxx11::string::~string((string *)local_270);
  std::__cxx11::string::~string((string *)positions);
  glu::operator<<(log,&program);
  if (program.m_program.m_info.linkOk != false) {
    positions[0xc] = 1.0;
    positions[0xd] = -1.0;
    positions[0xe] = 0.0;
    positions[0xf] = 1.0;
    positions[8] = 1.2;
    positions[9] = 1.2;
    positions[10] = 0.0;
    positions[0xb] = 1.2;
    positions[4] = -2.0;
    positions[5] = -2.0;
    positions[6] = 0.0;
    positions[7] = 2.0;
    positions[0] = -1.7;
    positions[1] = 1.7;
    positions[2] = 0.0;
    positions[3] = 1.7;
    indices[0] = 0;
    indices[1] = 1;
    indices[2] = 2;
    indices[3] = 2;
    indices[4] = 1;
    indices[5] = 3;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_270,"a_position",&local_299);
    glu::va::Float(&posBinding,(string *)local_270,4,4,0,positions);
    std::__cxx11::string::~string((string *)local_270);
    (**(code **)(CONCAT44(extraout_var,iVar3) + 0x1680))(program.m_program.m_program);
    local_270._0_4_ = R;
    local_270._4_4_ = UNORM_INT32;
    local_270._8_4_ = INDEXTYPE_UINT16;
    local_270._16_8_ = (allocator<char> *)indices;
    glu::draw(((this->super_TestCase).m_context)->m_renderCtx,program.m_program.m_program,1,
              &posBinding,(PrimitiveList *)local_270,(DrawUtilCallback *)0x0);
    pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
    tcu::Surface::getAccess((PixelBufferAccess *)local_270,&testImg);
    glu::readPixels(pRVar1,0,0,(PixelBufferAccess *)local_270);
    err = (**(code **)(CONCAT44(extraout_var,iVar3) + 0x800))();
    glu::checkError(err,"Draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderBuiltinVarTests.cpp"
                    ,0x1ba);
    std::__cxx11::string::~string((string *)&posBinding.binding.name);
    for (uVar5 = 0; (int)uVar5 < refImg.m_height; uVar5 = uVar5 + 1) {
      for (iVar6 = 0; iVar6 < refImg.m_width; iVar6 = iVar6 + 1) {
        fVar7 = ((float)iVar6 + 0.5) / (float)refImg.m_width;
        ny = ((float)(int)(refImg.m_height + ~uVar5) + 0.5) / (float)refImg.m_height;
        if (1.0 <= fVar7 + ny) {
          posBinding.binding.type = 0x3f800000;
          posBinding.binding._4_4_ = 0x3f99999a;
          posBinding.binding.name._M_dataplus._M_p._0_4_ = 0x40000000;
          positions[0] = 1.0;
          positions[1] = 1.2;
          positions[2] = 2.0;
          fVar7 = 1.0 - fVar7;
          ny = 1.0 - ny;
        }
        else {
          posBinding.binding.type = 0x3fd9999a;
          posBinding.binding._4_4_ = 0x40000000;
          posBinding.binding.name._M_dataplus._M_p._0_4_ = 0x3f99999a;
          positions[0] = 1.7;
          positions[1] = 2.0;
          positions[2] = 1.2;
        }
        fVar7 = projectedTriInterpolate((Vec3 *)&posBinding,(Vec3 *)positions,fVar7,ny);
        posBinding.binding._0_8_ = (ulong)(uint)(fVar7 + -1.0) << 0x20;
        posBinding.binding.name._M_dataplus._M_p = (pointer)0x3f80000000000000;
        tcu::RGBA::RGBA(&local_298,(Vec4 *)&posBinding);
        *(deUint32 *)((long)refImg.m_pixels.m_ptr + (long)(int)(refImg.m_width * uVar5 + iVar6) * 4)
             = local_298.m_value;
      }
    }
    bVar2 = tcu::pixelThresholdCompare
                      (log,"Result","Image comparison result",&refImg,&testImg,&threshold,
                       COMPARE_LOG_RESULT);
    description = "Image comparison failed";
    if (bVar2) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar2,
               description);
    glu::ShaderProgram::~ShaderProgram(&program);
    tcu::Surface::~Surface(&refImg);
    tcu::Surface::~Surface(&testImg);
    return STOP;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&posBinding,"Compile failed",(allocator<char> *)positions);
  tcu::TestError::TestError(this_00,(string *)&posBinding);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate (void)
	{
		TestLog&				log			= m_testCtx.getLog();
		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
		const int				width		= m_context.getRenderTarget().getWidth();
		const int				height		= m_context.getRenderTarget().getHeight();
		const tcu::RGBA			threshold	= tcu::RGBA(1,1,1,1) + m_context.getRenderTarget().getPixelFormat().getColorThreshold();

		tcu::Surface			testImg		(width, height);
		tcu::Surface			refImg		(width, height);

		const float				w[4]		= { 1.7f, 2.0f, 1.2f, 1.0f };

		const glu::ShaderProgram program(m_context.getRenderContext(), glu::makeVtxFragSources(
			"#version 300 es\n"
			"in highp vec4 a_position;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = a_position;\n"
			"}\n",

			"#version 300 es\n"
			"layout(location = 0) out mediump vec4 o_color;\n"
			"void main (void)\n"
			"{\n"
			"	o_color = vec4(0.0, 1.0/gl_FragCoord.w - 1.0, 0.0, 1.0);\n"
			"}\n"));

		log << program;

		if (!program.isOk())
			throw tcu::TestError("Compile failed");

		// Draw with GL.
		{
			const float positions[] =
			{
				-w[0],  w[0], 0.0f, w[0],
				-w[1], -w[1], 0.0f, w[1],
				 w[2],  w[2], 0.0f, w[2],
				 w[3], -w[3], 0.0f, w[3]
			};
			const deUint16 indices[] = { 0, 1, 2, 2, 1, 3 };

			glu::VertexArrayBinding	posBinding	= glu::va::Float("a_position", 4, 4, 0, &positions[0]);

			gl.useProgram(program.getProgram());

			glu::draw(m_context.getRenderContext(), program.getProgram(), 1, &posBinding,
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));

			glu::readPixels(m_context.getRenderContext(), 0, 0, testImg.getAccess());
			GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");
		}

		// Draw reference
		for (int y = 0; y < refImg.getHeight(); y++)
		{
			for (int x = 0; x < refImg.getWidth(); x++)
			{
				const float			xf			= (float(x)+.5f) / float(refImg.getWidth());
				const float			yf			= (float(refImg.getHeight()-y-1)+.5f) / float(refImg.getHeight());
				const float			oow			= ((xf + yf) < 1.0f)
												? projectedTriInterpolate(tcu::Vec3(w[0], w[1], w[2]), tcu::Vec3(w[0], w[1], w[2]), xf, yf)
												: projectedTriInterpolate(tcu::Vec3(w[3], w[2], w[1]), tcu::Vec3(w[3], w[2], w[1]), 1.0f-xf, 1.0f-yf);
				const tcu::Vec4		color		(0.0f, oow - 1.0f, 0.0f, 1.0f);

				refImg.setPixel(x, y, tcu::RGBA(color));
			}
		}

		// Compare
		{
			bool isOk = tcu::pixelThresholdCompare(log, "Result", "Image comparison result", refImg, testImg, threshold, tcu::COMPARE_LOG_RESULT);
			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}